

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O0

float CB_EXPLORE_ADF::binary_search(float fhat,float delta,float sens,float tol)

{
  float *pfVar1;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  double dVar4;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  int iter;
  float v;
  float w;
  float u;
  float l;
  float maxw;
  int local_34;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  local_1c = in_XMM0_Da / in_XMM2_Da;
  local_20 = 3.4028235e+38;
  local_14 = in_XMM3_Da;
  local_10 = in_XMM2_Da;
  local_c = in_XMM1_Da;
  local_8 = in_XMM0_Da;
  pfVar1 = std::min<float>(&local_1c,&local_20);
  local_28 = *pfVar1;
  local_4 = local_28;
  if (local_c < local_28 * local_8 * local_8) {
    local_24 = 0.0;
    local_18 = local_28;
    for (local_34 = 0; local_34 < 0x14; local_34 = local_34 + 1) {
      fVar2 = (local_28 + local_24) / 2.0;
      fVar3 = fVar2 * (local_8 * local_8 +
                      -((-local_10 * fVar2 + local_8) * (-local_10 * fVar2 + local_8))) + -local_c;
      if (0.0 < fVar3) {
        local_28 = fVar2;
        fVar2 = local_24;
      }
      local_24 = fVar2;
      dVar4 = std::fabs((double)(ulong)(uint)fVar3);
      if ((SUB84(dVar4,0) <= local_14) || (local_28 - local_24 <= local_14)) break;
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

float binary_search(float fhat, float delta, float sens, float tol = 1e-6)
{
  const float maxw = min(fhat / sens, FLT_MAX);

  if (maxw * fhat * fhat <= delta)
    return maxw;

  float l = 0;
  float u = maxw;
  float w, v;

  for (int iter = 0; iter < B_SEARCH_MAX_ITER; iter++)
  {
    w = (u + l) / 2.f;
    v = w * (fhat * fhat - (fhat - sens * w) * (fhat - sens * w)) - delta;
    if (v > 0)
      u = w;
    else
      l = w;
    if (fabs(v) <= tol || u - l <= tol)
      break;
  }

  return l;
}